

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
 pdqsort_detail::
 partition_right_branchless<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,presolve::HPresolve::aggregator(presolve::HighsPostsolveStack&)::__1>
           (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
            begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                  end,anon_class_8_1_8991fb9c comp)

{
  bool bVar1;
  reference ppVar2;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *p_Var3;
  unsigned_long *puVar4;
  reference ppVar5;
  pair<int,_int> *in_RSI;
  pair<int,_int> *in_RDI;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
  pVar6;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  pivot_pos;
  size_t num;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t right_split;
  size_t left_split;
  size_t num_unknown;
  size_t start_r;
  size_t start_l;
  size_t num_r;
  size_t num_l;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  offsets_r_base;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  offsets_l_base;
  uchar *offsets_r;
  uchar *offsets_l;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  bool already_partitioned;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  last;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  first;
  T pivot;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffd98;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffda0;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *in_stack_fffffffffffffda8;
  pair<int,_int> *local_250;
  pair<int,_int> *local_248;
  pair<int,_int> *local_240;
  byte local_231;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_220;
  pair<int,_int> *local_218;
  pair<int,_int> *local_210;
  undefined8 in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  last_00;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  in_stack_fffffffffffffe20;
  pair<int,_int> *in_stack_fffffffffffffe28;
  pair<int,_int> *ppVar7;
  pair<int,_int> *in_stack_fffffffffffffe30;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffe38;
  anon_class_8_1_8991fb9c *paVar8;
  anon_class_8_1_8991fb9c *paVar9;
  long local_1a8;
  long local_1a0;
  unsigned_long local_198;
  unsigned_long local_190;
  pair<int,_int> *local_188;
  pair<int,_int> *local_180;
  uchar *local_178;
  uchar *local_170;
  uchar local_168 [128];
  uchar local_e8 [136];
  pair<int,_int> *local_60;
  pair<int,_int> *local_58;
  undefined1 local_49;
  pair<int,_int> *local_48;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_40;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_38;
  pair<int,_int> local_30 [2];
  pair<int,_int> *local_20;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_18 [3];
  
  local_20 = in_RSI;
  local_18[0]._M_current = in_RDI;
  ppVar2 = __gnu_cxx::
           __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           ::operator*(local_18);
  local_30[0] = *ppVar2;
  local_38._M_current = local_18[0]._M_current;
  local_40._M_current = local_20;
  do {
    p_Var3 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator++(&local_38);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator*(p_Var3);
    bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                      (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                      );
  } while (bVar1);
  local_48 = (pair<int,_int> *)
             __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator-(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0._M_current);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)in_stack_fffffffffffffda0._M_current,
                     (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)in_stack_fffffffffffffd98._M_current);
  if (bVar1) {
    do {
      bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          *)in_stack_fffffffffffffda0._M_current,
                         (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                          *)in_stack_fffffffffffffd98._M_current);
      local_231 = 0;
      if (bVar1) {
        p_Var3 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator--(&local_40);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator*(p_Var3);
        bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                          (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                           in_stack_fffffffffffffe28);
        local_231 = bVar1 ^ 0xff;
      }
    } while ((local_231 & 1) != 0);
  }
  else {
    do {
      p_Var3 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator--(&local_40);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator*(p_Var3);
      bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                        (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                         in_stack_fffffffffffffe28);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  local_49 = __gnu_cxx::operator>=
                       ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         *)in_stack_fffffffffffffda0._M_current,
                        (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         *)in_stack_fffffffffffffd98._M_current);
  if (!(bool)local_49) {
    local_58 = local_38._M_current;
    local_60 = local_40._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_38);
    local_170 = align_cacheline<unsigned_char>(local_e8);
    local_178 = align_cacheline<unsigned_char>(local_168);
    local_180 = local_38._M_current;
    local_188 = local_40._M_current;
    local_1a8 = 0;
    local_1a0 = 0;
    local_198 = 0;
    local_190 = 0;
    while (bVar1 = __gnu_cxx::operator<
                             ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)in_stack_fffffffffffffda0._M_current,
                              (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)in_stack_fffffffffffffd98._M_current), bVar1) {
      local_250 = (pair<int,_int> *)
                  __gnu_cxx::operator-
                            (in_stack_fffffffffffffda0._M_current,
                             in_stack_fffffffffffffd98._M_current);
      if (local_190 == 0) {
        local_240 = local_250;
        if (local_198 == 0) {
          local_240 = (pair<int,_int> *)((ulong)local_250 >> 1);
        }
        local_248 = local_240;
      }
      else {
        local_248 = (pair<int,_int> *)0x0;
      }
      if (local_198 == 0) {
        local_250 = (pair<int,_int> *)((long)local_250 - (long)local_248);
      }
      else {
        local_250 = (pair<int,_int> *)0x0;
      }
      if (local_248 < (pair<int,_int> *)0x40) {
        in_stack_fffffffffffffe30 = (pair<int,_int> *)0x0;
        while (in_stack_fffffffffffffe30 < local_248) {
          ppVar7 = (pair<int,_int> *)((long)&in_stack_fffffffffffffe30->first + 1);
          local_170[local_190] = (uchar)in_stack_fffffffffffffe30;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&local_38);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,ppVar7,in_stack_fffffffffffffe28);
          local_190 = ((bVar1 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_38);
          in_stack_fffffffffffffe30 = ppVar7;
        }
      }
      else {
        in_stack_fffffffffffffe38 = (anon_class_8_1_8991fb9c *)0x0;
        while (in_stack_fffffffffffffe38 < (anon_class_8_1_8991fb9c *)0x40) {
          paVar8 = (anon_class_8_1_8991fb9c *)((long)&in_stack_fffffffffffffe38->this + 1);
          local_170[local_190] = (uchar)in_stack_fffffffffffffe38;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&local_38);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (paVar8,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          local_190 = ((bVar1 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_38);
          paVar9 = (anon_class_8_1_8991fb9c *)((long)&paVar8->this + 1);
          local_170[local_190] = (uchar)paVar8;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&local_38);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (paVar9,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          local_190 = ((bVar1 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_38);
          paVar8 = (anon_class_8_1_8991fb9c *)((long)&paVar9->this + 1);
          local_170[local_190] = (uchar)paVar9;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&local_38);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (paVar8,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          local_190 = ((bVar1 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_38);
          paVar9 = (anon_class_8_1_8991fb9c *)((long)&paVar8->this + 1);
          local_170[local_190] = (uchar)paVar8;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&local_38);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (paVar9,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          local_190 = ((bVar1 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_38);
          paVar8 = (anon_class_8_1_8991fb9c *)((long)&paVar9->this + 1);
          local_170[local_190] = (uchar)paVar9;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&local_38);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (paVar8,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          local_190 = ((bVar1 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_38);
          paVar9 = (anon_class_8_1_8991fb9c *)((long)&paVar8->this + 1);
          local_170[local_190] = (uchar)paVar8;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&local_38);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (paVar9,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          local_190 = ((bVar1 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_38);
          paVar8 = (anon_class_8_1_8991fb9c *)((long)&paVar9->this + 1);
          local_170[local_190] = (uchar)paVar9;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&local_38);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (paVar8,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          local_190 = ((bVar1 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_38);
          in_stack_fffffffffffffe38 = (anon_class_8_1_8991fb9c *)((long)&paVar8->this + 1);
          local_170[local_190] = (uchar)paVar8;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&local_38);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                             in_stack_fffffffffffffe28);
          local_190 = ((bVar1 ^ 0xffU) & 1) + local_190;
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator++(&local_38);
        }
      }
      if (local_250 < (pair<int,_int> *)0x40) {
        in_stack_fffffffffffffe20._M_current = (pair<int,_int> *)0x0;
        while (in_stack_fffffffffffffe20._M_current < local_250) {
          in_stack_fffffffffffffe20._M_current =
               (pair<int,_int> *)((long)&(in_stack_fffffffffffffe20._M_current)->first + 1);
          local_178[local_198] = (uchar)in_stack_fffffffffffffe20._M_current;
          p_Var3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(p_Var3);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                             in_stack_fffffffffffffe28);
          local_198 = bVar1 + local_198;
        }
      }
      else {
        in_stack_fffffffffffffe28 = (pair<int,_int> *)0x0;
        while (in_stack_fffffffffffffe28 < (pair<int,_int> *)0x40) {
          ppVar7 = (pair<int,_int> *)((long)&in_stack_fffffffffffffe28->first + 1);
          local_178[local_198] = (uchar)ppVar7;
          p_Var3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(p_Var3);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,ppVar7);
          local_198 = bVar1 + local_198;
          ppVar7 = (pair<int,_int> *)((long)&ppVar7->first + 1);
          local_178[local_198] = (uchar)ppVar7;
          p_Var3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(p_Var3);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,ppVar7);
          local_198 = bVar1 + local_198;
          ppVar7 = (pair<int,_int> *)((long)&ppVar7->first + 1);
          local_178[local_198] = (uchar)ppVar7;
          p_Var3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(p_Var3);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,ppVar7);
          local_198 = bVar1 + local_198;
          ppVar7 = (pair<int,_int> *)((long)&ppVar7->first + 1);
          local_178[local_198] = (uchar)ppVar7;
          p_Var3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(p_Var3);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,ppVar7);
          local_198 = bVar1 + local_198;
          ppVar7 = (pair<int,_int> *)((long)&ppVar7->first + 1);
          local_178[local_198] = (uchar)ppVar7;
          p_Var3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(p_Var3);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,ppVar7);
          local_198 = bVar1 + local_198;
          ppVar7 = (pair<int,_int> *)((long)&ppVar7->first + 1);
          local_178[local_198] = (uchar)ppVar7;
          p_Var3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(p_Var3);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,ppVar7);
          local_198 = bVar1 + local_198;
          ppVar7 = (pair<int,_int> *)((long)&ppVar7->first + 1);
          local_178[local_198] = (uchar)ppVar7;
          p_Var3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(p_Var3);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,ppVar7);
          local_198 = bVar1 + local_198;
          in_stack_fffffffffffffe28 = (pair<int,_int> *)((long)&ppVar7->first + 1);
          local_178[local_198] = (uchar)in_stack_fffffffffffffe28;
          p_Var3 = __gnu_cxx::
                   __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(p_Var3);
          bVar1 = presolve::HPresolve::aggregator::anon_class_8_1_8991fb9c::operator()
                            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                             in_stack_fffffffffffffe28);
          local_198 = bVar1 + local_198;
        }
      }
      puVar4 = std::min<unsigned_long>(&local_190,&local_198);
      last_00._M_current = (pair<int,_int> *)*puVar4;
      swap_offsets<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                (in_stack_fffffffffffffe20,last_00,(uchar *)local_180,(uchar *)local_188,
                 in_stack_fffffffffffffe00,SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x38,0));
      local_190 = local_190 - (long)last_00._M_current;
      local_198 = local_198 - (long)last_00._M_current;
      local_1a0 = (long)&(last_00._M_current)->first + local_1a0;
      local_1a8 = (long)&(last_00._M_current)->first + local_1a8;
      if (local_190 == 0) {
        local_1a0 = 0;
        local_180 = local_38._M_current;
      }
      if (local_198 == 0) {
        local_1a8 = 0;
        local_188 = local_40._M_current;
      }
    }
    if (local_190 != 0) {
      local_170 = local_170 + local_1a0;
      while (local_190 != 0) {
        local_190 = local_190 - 1;
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator+(in_stack_fffffffffffffda8,(difference_type)in_stack_fffffffffffffda0._M_current)
        ;
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator--(&local_40);
        std::
        iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      }
      local_38._M_current = local_40._M_current;
      local_190 = local_190 - 1;
    }
    if (local_198 != 0) {
      local_178 = local_178 + local_1a8;
      while (local_198 != 0) {
        local_198 = local_198 - 1;
        local_210 = (pair<int,_int> *)
                    __gnu_cxx::
                    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    ::operator-(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0._M_current);
        local_218 = local_38._M_current;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        ::operator++(&local_38);
      }
      local_40._M_current = local_38._M_current;
      local_198 = local_198 - 1;
    }
  }
  local_220 = __gnu_cxx::
              __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
              ::operator-(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0._M_current);
  p_Var3 = &local_220;
  ppVar2 = __gnu_cxx::
           __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           ::operator*(p_Var3);
  ppVar5 = __gnu_cxx::
           __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           ::operator*(local_18);
  std::pair<int,_int>::operator=(ppVar5,ppVar2);
  ppVar5 = __gnu_cxx::
           __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
           ::operator*(p_Var3);
  std::pair<int,_int>::operator=(ppVar5,local_30);
  pVar6 = std::
          make_pair<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>&,bool&>
                    ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      *)ppVar2,(bool *)in_stack_fffffffffffffd98._M_current);
  return pVar6;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }